

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O0

bool __thiscall
miniros::master::ParameterStorage::deleteParam(ParameterStorage *this,string *caller_id,string *key)

{
  bool bVar1;
  Error EVar2;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> p;
  Path path;
  scoped_lock<std::mutex> m_lock;
  string fullKey;
  bool enabled;
  char *in_stack_fffffffffffffe18;
  Path *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  LogLocation *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe40;
  Level LVar3;
  string *in_stack_fffffffffffffe48;
  LogLocation *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar4;
  Path *in_stack_fffffffffffffe68;
  string local_160 [32];
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> local_140;
  Error_t local_12c;
  undefined1 in_stack_fffffffffffffee7;
  Path *in_stack_fffffffffffffee8;
  ParameterStorage *in_stack_fffffffffffffef0;
  string local_b8 [35];
  undefined1 local_95;
  RpcValue *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  ParameterStorage *in_stack_ffffffffffffff88;
  string local_60 [31];
  undefined1 in_stack_ffffffffffffffbf;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  bool local_1;
  
  LVar3 = (Level)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((deleteParam::loc.initialized_ ^ 0xffU) & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (allocator<char> *)in_stack_fffffffffffffe50);
    ::std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    ::std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    console::initializeLogLocation(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,LVar3);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  }
  if (deleteParam::loc.level_ != Info) {
    console::setLogLocationLevel
              ((LogLocation *)in_stack_fffffffffffffe20,
               (Level)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    console::checkLogLocationEnabled(in_stack_fffffffffffffe30);
  }
  LVar3 = deleteParam::loc.level_;
  local_95 = (deleteParam::loc.logger_enabled_ & 1U) != 0;
  if ((bool)local_95) {
    in_stack_fffffffffffffe68 = (Path *)deleteParam::loc.logger_;
    in_stack_fffffffffffffe20 = (Path *)::std::__cxx11::string::c_str();
    in_stack_fffffffffffffe28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::__cxx11::string::c_str();
    in_stack_fffffffffffffe18 = "deleteParam %s from %s";
    console::print((FilterBase *)0x0,in_stack_fffffffffffffe68,(Level)(ulong)LVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x1d,
                   "bool miniros::master::ParameterStorage::deleteParam(const std::string &, const std::string &)"
                  );
  }
  names::resolve(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf
                );
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe20,
             (mutex_type *)in_stack_fffffffffffffe18);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe64);
  if (bVar1) {
    XmlRpc::XmlRpcValue::Dict();
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)CONCAT44(uVar4,in_stack_fffffffffffffe60),
               (XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x550fe2);
    checkParamUpdates(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
    ;
    local_1 = true;
  }
  else {
    names::Path::Path(in_stack_fffffffffffffe20);
    EVar2 = names::Path::fromString
                      (in_stack_fffffffffffffe68,(string *)CONCAT44(uVar4,in_stack_fffffffffffffe60)
                      );
    local_12c = EVar2.code;
    local_140 = findParameter(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                              (bool)in_stack_fffffffffffffee7);
    if ((local_140.first == (XmlRpcValue *)0x0) || (local_140.second == (XmlRpcValue *)0x0)) {
      local_1 = false;
    }
    else {
      names::Path::name_abi_cxx11_((Path *)CONCAT44(EVar2.code,in_stack_fffffffffffffe58));
      XmlRpc::XmlRpcValue::eraseMember
                ((XmlRpcValue *)in_stack_fffffffffffffe28,(string *)in_stack_fffffffffffffe20);
      ::std::__cxx11::string::~string(local_160);
      checkParamUpdates(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff78);
      local_1 = true;
    }
    names::Path::~Path(in_stack_fffffffffffffe20);
  }
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x5511fe);
  ::std::__cxx11::string::~string(local_b8);
  return local_1;
}

Assistant:

bool ParameterStorage::deleteParam(const std::string& caller_id, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "deleteParam %s from %s", key.c_str(), caller_id.c_str());
  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  std::scoped_lock<std::mutex> m_lock(m_parameterLock);
  if (fullKey == "/") {
    m_parameterRoot = RpcValue::Dict();
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  names::Path path;
  path.fromString(fullKey);

  auto p = findParameter(path, false);
  if (p.first && p.second) {
    p.second->eraseMember(path.name());
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  return false;
}